

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::Secp256k1::CompressPubkeySecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *uncompressed_pubkey)

{
  int iVar1;
  undefined8 uVar2;
  size_t sVar3;
  uchar *puVar4;
  string *in_stack_fffffffffffffdb0;
  string *message;
  size_type in_stack_fffffffffffffdb8;
  CfdError CVar6;
  secp256k1_context *psVar5;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  allocator local_1b1;
  string local_1b0 [32];
  CfdSourceLocation local_190;
  size_type local_178;
  size_t byte_size;
  undefined1 local_168 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  string local_148 [32];
  CfdSourceLocation local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  int local_f8;
  undefined1 local_f2 [2];
  int ret;
  secp256k1_pubkey pubkey;
  CfdSourceLocation local_90;
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  CfdSourceLocation local_40;
  secp256k1_context *local_28;
  secp256k1_context *context;
  ByteData *uncompressed_pubkey_local;
  Secp256k1 *this_local;
  
  local_28 = (secp256k1_context *)this->secp256k1_context_;
  context = (secp256k1_context *)uncompressed_pubkey;
  uncompressed_pubkey_local = (ByteData *)this;
  this_local = (Secp256k1 *)__return_storage_ptr__;
  if (this->secp256k1_context_ == (void *)0x0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    CVar6 = (CfdError)(in_stack_fffffffffffffdb8 >> 0x20);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x77;
    local_40.funcname = "CompressPubkeySecp256k1Ec";
    logger::warn<>(&local_40,"Secp256k1 context is NULL.");
    local_75 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_60,"Secp256k1 context is NULL.",&local_61);
    CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),CVar6,
               in_stack_fffffffffffffdb0);
    local_75 = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar3 = ByteData::GetDataSize(uncompressed_pubkey);
  psVar5 = local_28;
  if (sVar3 != 0x41) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    CVar6 = (CfdError)(in_stack_fffffffffffffdb8 >> 0x20);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x7d;
    local_90.funcname = "CompressPubkeySecp256k1Ec";
    logger::warn<>(&local_90,"Invalid Argument pubkey size.");
    pubkey.data[0x38] = '\x01';
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(pubkey.data + 0x3a),"Invalid Pubkey size.",
               (allocator *)(pubkey.data + 0x39));
    CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),CVar6,
               in_stack_fffffffffffffdb0);
    pubkey.data[0x38] = '\0';
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&local_110,(ByteData *)context);
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x485eb1);
  sVar3 = ByteData::GetDataSize((ByteData *)context);
  iVar1 = secp256k1_ec_pubkey_parse(psVar5,(secp256k1_pubkey_conflict *)local_f2,puVar4,sVar3);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdb0);
  local_f8 = iVar1;
  if (iVar1 != 1) {
    local_128.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    CVar6 = (CfdError)(in_stack_fffffffffffffdb8 >> 0x20);
    local_128.filename = local_128.filename + 1;
    local_128.line = 0x87;
    local_128.funcname = "CompressPubkeySecp256k1Ec";
    logger::warn<>(&local_128,"Secp256k1 pubkey parse Error.");
    byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_148,"Secp256k1 pubkey parse Error.",
               (allocator *)
               ((long)&byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),CVar6,
               in_stack_fffffffffffffdb0);
    byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x48606a);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
             ,(allocator_type *)in_stack_fffffffffffffdb0);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x486090);
  message = (string *)local_168;
  local_178 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  psVar5 = local_28;
  puVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x4860c1);
  iVar1 = secp256k1_ec_pubkey_serialize
                    (psVar5,puVar4,&local_178,(secp256k1_pubkey_conflict *)local_f2,0x102);
  local_f8 = iVar1;
  if (iVar1 != 1) {
    local_190.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    CVar6 = (CfdError)((ulong)psVar5 >> 0x20);
    local_190.filename = local_190.filename + 1;
    local_190.line = 0x92;
    local_190.funcname = "CompressPubkeySecp256k1Ec";
    logger::warn<>(&local_190,"Secp256k1 pubkey serialize Error.");
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1b0,"Secp256k1 pubkey serialize Error.",&local_1b1);
    CfdException::CfdException
              ((CfdException *)CONCAT44(iVar1,in_stack_fffffffffffffdc0),CVar6,message);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(1,in_stack_fffffffffffffdc0),(size_type)psVar5);
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  return __return_storage_ptr__;
}

Assistant:

ByteData Secp256k1::CompressPubkeySecp256k1Ec(
    const ByteData& uncompressed_pubkey) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }

  if (uncompressed_pubkey.GetDataSize() != 65) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }

  secp256k1_pubkey pubkey;
  int ret = secp256k1_ec_pubkey_parse(
      context, &pubkey, uncompressed_pubkey.GetBytes().data(),
      uncompressed_pubkey.GetDataSize());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey parse Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 pubkey parse Error.");
  }

  std::vector<uint8_t> byte_data(33);
  size_t byte_size = byte_data.size();
  // Format ByteData
  ret = secp256k1_ec_pubkey_serialize(
      context, byte_data.data(), &byte_size, &pubkey, SECP256K1_EC_COMPRESSED);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "Secp256k1 pubkey serialize Error.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 pubkey serialize Error.");
  }

  byte_data.resize(byte_size);
  return ByteData(byte_data);
}